

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void anon_unknown.dwarf_f6bf2::RenderDrawLists(ImDrawData *draw_data)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImDrawList *this;
  ImDrawVert *pIVar3;
  unsigned_short *puVar4;
  int fb_width_00;
  GLuint GVar5;
  ImGuiIO *pIVar6;
  undefined1 local_b0 [4];
  GLuint textureHandle;
  ImVec4 clip_rect;
  ImDrawCmd *pcmd;
  int cmd_i;
  ImDrawIdx *idx_buffer;
  ImDrawVert *vtx_buffer;
  ImDrawList *cmd_list;
  float fStack_70;
  int n;
  ImVec2 clip_scale;
  ImVec2 clip_off;
  GLint last_tex_env_mode;
  GLint last_shade_model;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  undefined4 local_2c;
  undefined4 local_28;
  GLint last_polygon_mode [2];
  GLint last_texture;
  int fb_height;
  int fb_width;
  ImGuiIO *io;
  ImDrawData *draw_data_local;
  
  ImGui::GetDrawData();
  if (draw_data->CmdListsCount != 0) {
    pIVar6 = ImGui::GetIO();
    if (pIVar6->Fonts->TexID == (ImTextureID)0x0) {
      __assert_fail("io.Fonts->TexID != (ImTextureID)NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-sfml-src/imgui-SFML.cpp"
                    ,0x366,"void (anonymous namespace)::RenderDrawLists(ImDrawData *)");
    }
    fb_width_00 = (int)((draw_data->DisplaySize).x * (draw_data->FramebufferScale).x);
    last_polygon_mode[1] = (GLint)((draw_data->DisplaySize).y * (draw_data->FramebufferScale).y);
    if ((fb_width_00 != 0) && (last_polygon_mode[1] != 0)) {
      ImDrawData::ScaleClipRects(draw_data,&pIVar6->DisplayFramebufferScale);
      glGetIntegerv(0x8069,last_polygon_mode);
      glGetIntegerv(0xb40,&local_2c);
      glGetIntegerv(0xba2,last_scissor_box + 2);
      glGetIntegerv(0xc10,&last_tex_env_mode);
      glGetIntegerv(0xb54,&clip_off.y);
      glGetTexEnviv(0x2300,0x2200,&clip_off);
      glPushAttrib(0x7000);
      SetupRenderState(draw_data,fb_width_00,last_polygon_mode[1]);
      IVar1 = draw_data->DisplayPos;
      IVar2 = draw_data->FramebufferScale;
      for (cmd_list._4_4_ = 0; cmd_list._4_4_ < draw_data->CmdListsCount;
          cmd_list._4_4_ = cmd_list._4_4_ + 1) {
        this = draw_data->CmdLists[cmd_list._4_4_];
        pIVar3 = (this->VtxBuffer).Data;
        puVar4 = (this->IdxBuffer).Data;
        glVertexPointer(2,0x1406,0x14,pIVar3);
        glTexCoordPointer(2,0x1406,0x14,&pIVar3->uv);
        glColorPointer(4,0x1401,0x14,&pIVar3->col);
        for (pcmd._4_4_ = 0; pcmd._4_4_ < (this->CmdBuffer).Size; pcmd._4_4_ = pcmd._4_4_ + 1) {
          clip_rect._8_8_ = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,pcmd._4_4_);
          if (((ImDrawCmd *)clip_rect._8_8_)->UserCallback == (ImDrawCallback)0x0) {
            ImVec4::ImVec4((ImVec4 *)local_b0);
            clip_scale.x = IVar1.x;
            fStack_70 = IVar2.x;
            local_b0 = (undefined1  [4])((*(float *)clip_rect._8_8_ - clip_scale.x) * fStack_70);
            clip_scale.y = IVar1.y;
            n = (int)IVar2.y;
            textureHandle = (GLuint)((*(float *)(clip_rect._8_8_ + 4) - clip_scale.y) * (float)n);
            clip_rect.x = (*(float *)(clip_rect._8_8_ + 8) - clip_scale.x) * fStack_70;
            clip_rect.y = (*(float *)(clip_rect._8_8_ + 0xc) - clip_scale.y) * (float)n;
            if (((((float)local_b0 < (float)fb_width_00) &&
                 ((float)textureHandle < (float)last_polygon_mode[1])) && (0.0 <= clip_rect.x)) &&
               (0.0 <= clip_rect.y)) {
              glScissor((int)(float)local_b0,(int)((float)last_polygon_mode[1] - clip_rect.y),
                        (int)(clip_rect.x - (float)local_b0),
                        (int)(clip_rect.y - (float)textureHandle));
              GVar5 = convertImTextureIDToGLTextureHandle(*(ImTextureID *)(clip_rect._8_8_ + 0x10));
              glBindTexture(0xde1,GVar5);
              glDrawElements(4,*(undefined4 *)(clip_rect._8_8_ + 0x20),0x1403,
                             puVar4 + *(uint *)(clip_rect._8_8_ + 0x1c));
            }
          }
          else if (((ImDrawCmd *)clip_rect._8_8_)->UserCallback ==
                   (ImDrawCallback)0xffffffffffffffff) {
            SetupRenderState(draw_data,fb_width_00,last_polygon_mode[1]);
          }
          else {
            (*((ImDrawCmd *)clip_rect._8_8_)->UserCallback)(this,(ImDrawCmd *)clip_rect._8_8_);
          }
        }
      }
      glDisableClientState(0x8076);
      glDisableClientState(0x8078);
      glDisableClientState(0x8074);
      glBindTexture(0xde1,last_polygon_mode[0]);
      glMatrixMode(0x1700);
      glPopMatrix();
      glMatrixMode(0x1701);
      glPopMatrix();
      glPopAttrib();
      glPolygonMode(0x404,local_2c);
      glPolygonMode(0x405,local_28);
      glViewport(last_scissor_box[2],last_scissor_box[3],last_viewport[0],last_viewport[1]);
      glScissor(last_tex_env_mode,last_shade_model,last_scissor_box[0],last_scissor_box[1]);
      glShadeModel(clip_off.y);
      glTexEnvi(0x2300,0x2200,clip_off.x);
    }
  }
  return;
}

Assistant:

void RenderDrawLists(ImDrawData* draw_data) {
    ImGui::GetDrawData();
    if (draw_data->CmdListsCount == 0) {
        return;
    }

    ImGuiIO& io = ImGui::GetIO();
    assert(io.Fonts->TexID != (ImTextureID)NULL); // You forgot to create and set font texture

    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates !=
    // framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0) return;
    draw_data->ScaleClipRects(io.DisplayFramebufferScale);

    // Backup GL state
    // Backup GL state
    GLint last_texture;
    glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2];
    glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4];
    glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4];
    glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_shade_model;
    glGetIntegerv(GL_SHADE_MODEL, &last_shade_model);
    GLint last_tex_env_mode;
    glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);

#ifdef GL_VERSION_ES_CL_1_1
    GLint last_array_buffer;
    glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
    GLint last_element_array_buffer;
    glGetIntegerv(GL_ELEMENT_ARRAY_BUFFER_BINDING, &last_element_array_buffer);
#else
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);
#endif

    // Setup desired GL state
    SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos; // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are
                                                     // often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++) {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert),
                        (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert),
                          (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert),
                       (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++) {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback) {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to
                // request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            } else {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f &&
                    clip_rect.w >= 0.0f) {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w),
                              (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    GLuint textureHandle = convertImTextureIDToGLTextureHandle(pcmd->TextureId);
                    glBindTexture(GL_TEXTURE_2D, textureHandle);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount,
                                   sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT,
                                   idx_buffer + pcmd->IdxOffset);
                }
            }
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]);
    glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2],
               (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2],
              (GLsizei)last_scissor_box[3]);
    glShadeModel(last_shade_model);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);

#ifdef GL_VERSION_ES_CL_1_1
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, last_element_array_buffer);
    glDisable(GL_SCISSOR_TEST);
#endif
}